

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

bool slang::ast::TaggedPattern::createVars
               (ASTContext *context,TaggedPatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  SourceRange sourceRange;
  string_view arg;
  string_view name;
  bool bVar1;
  Symbol *pSVar2;
  Diagnostic *diag_00;
  long in_RSI;
  ASTContext *in_RDI;
  SourceRange SVar3;
  FieldSymbol *field;
  Diagnostic *diag;
  Symbol *member;
  string_view memberName;
  Type *in_stack_ffffffffffffff40;
  Type *in_stack_ffffffffffffff48;
  Token *in_stack_ffffffffffffff50;
  ASTContext *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  DiagCode code;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *local_88;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uVar4;
  Diagnostic *in_stack_ffffffffffffff90;
  Scope *context_00;
  char *in_stack_ffffffffffffffa8;
  string_view local_50;
  SourceRange in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_1;
  
  code = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
  bVar1 = Type::isTaggedUnion(in_stack_ffffffffffffff48);
  if (bVar1) {
    local_50 = parsing::Token::valueText(in_stack_ffffffffffffff50);
    Type::getCanonicalType(in_stack_ffffffffffffff40);
    Symbol::as<slang::ast::Scope>((Symbol *)0x12aa2c2);
    name._M_str = in_stack_ffffffffffffffa8;
    name._M_len = (size_t)local_50._M_str;
    context_00 = (Scope *)local_50._M_len;
    pSVar2 = Scope::find((Scope *)local_50._M_len,name);
    if (pSVar2 == (Symbol *)0x0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_50);
      if (!bVar1) {
        uVar4 = 0x3a000a;
        SVar3 = parsing::Token::range((Token *)in_stack_ffffffffffffff60);
        SVar3.endLoc = SVar3.endLoc;
        SVar3.endLoc = in_stack_ffffffffffffff68;
        SVar3.startLoc = in_stack_ffffffffffffff60;
        diag_00 = ASTContext::addDiag(in_stack_ffffffffffffff58,code,SVar3);
        arg._M_len._4_4_ = uVar4;
        arg._M_len._0_4_ = in_stack_ffffffffffffff88;
        arg._M_str = (char *)diag_00;
        Diagnostic::operator<<((Diagnostic *)SVar3.endLoc,arg);
        ast::operator<<(diag_00,(Type *)CONCAT44(uVar4,in_stack_ffffffffffffff88));
      }
      Pattern::createPlaceholderVars
                ((ASTContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (PatternSyntax *)in_stack_ffffffffffffffc0.endLoc,
                 (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)
                 in_stack_ffffffffffffffc0.startLoc);
      local_1 = false;
    }
    else if (*(long *)(in_RSI + 0x38) == 0) {
      local_1 = true;
    }
    else {
      Symbol::as<slang::ast::FieldSymbol>((Symbol *)0x12aa3e2);
      ValueSymbol::getType((ValueSymbol *)0x12aa40f);
      local_1 = Pattern::createPatternVars
                          ((ASTContext *)context_00,(PatternSyntax *)in_stack_ffffffffffffff90,
                           (Type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           local_88);
    }
  }
  else {
    bVar1 = Type::isError((Type *)0x12aa1f9);
    if (!bVar1) {
      in_stack_ffffffffffffffd4 = 0x880007;
      in_stack_ffffffffffffffc0 =
           slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff90);
      sourceRange.endLoc = in_stack_ffffffffffffff68;
      sourceRange.startLoc = in_stack_ffffffffffffff60;
      ASTContext::addDiag(in_RDI,code,sourceRange);
      ast::operator<<(in_stack_ffffffffffffff90,
                      (Type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    Pattern::createPlaceholderVars
              ((ASTContext *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (PatternSyntax *)in_stack_ffffffffffffffc0.endLoc,
               (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)
               in_stack_ffffffffffffffc0.startLoc);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TaggedPattern::createVars(const ASTContext& context, const syntax::TaggedPatternSyntax& syntax,
                               const Type& targetType,
                               SmallVector<const PatternVarSymbol*>& results) {
    if (!targetType.isTaggedUnion()) {
        if (!targetType.isError())
            context.addDiag(diag::PatternTaggedType, syntax.sourceRange()) << targetType;

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    auto memberName = syntax.memberName.valueText();
    auto member = targetType.getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.memberName.range());
            diag << memberName << targetType;
        }

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    if (!syntax.pattern)
        return true;

    auto& field = member->as<FieldSymbol>();
    return createPatternVars(context, *syntax.pattern, field.getType(), results);
}